

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeMapPrototype
               (DynamicObject *mapPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar5;
  RuntimeFunction *pRVar2;
  RuntimeFunction *pRVar3;
  StaticType *type;
  LiteralString *pLVar4;
  ulong uVar6;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,mapPrototype,mode,0xd,1);
  this = (((mapPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar6 = (ulong)uVar5 << 0x20;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (mapPrototype,0x67,(this->super_JavascriptLibraryBase).mapConstructor.ptr,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Clear,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x62);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x62,pRVar2,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Delete,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x6f);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x6f,pRVar2,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::ForEach,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x93);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x93,pRVar2,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Get,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x198);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x198,pRVar2,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Has,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xb4);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0xb4,pRVar2,6,0,0,uVar6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Set,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x19b);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x19b,pRVar2,6,0,0,uVar6);
  pRVar2 = CreateGetterFunction(this,0x14f,(FunctionInfo *)JavascriptMap::EntryInfo::SizeGetter);
  if (pRVar2 == (RuntimeFunction *)0x0) {
    pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(mapPrototype,0x14f,pRVar2);
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(mapPrototype,0x14f,6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Entries,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x7a);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x7a,pRVar2,6,0,0,uVar6);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Keys,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xcf);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0xcf,pRVar3,6,0,0,uVar6);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptMap::EntryInfo::Values,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,399);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,399,pRVar3,6,0,0,uVar6);
  uVar6 = uVar6 & 0xffffffff00000000;
  (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x14,pRVar2,6,0,0,uVar6);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar4 = LiteralString::New(type,L"Map",3,this->recycler);
    (*(mapPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mapPrototype,0x1b,pLVar4,2,0,0,uVar6 & 0xffffffff00000000)
    ;
  }
  DynamicObject::SetHasNoEnumerableProperties(mapPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMapPrototype(DynamicObject* mapPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mapPrototype, mode, 13, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMap
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = mapPrototype->GetScriptContext();
        JavascriptLibrary* library = mapPrototype->GetLibrary();
        library->AddMember(mapPrototype, PropertyIds::constructor, library->mapConstructor);

        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::clear, &JavascriptMap::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::delete_, &JavascriptMap::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::forEach, &JavascriptMap::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::get, &JavascriptMap::EntryInfo::Get, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::has, &JavascriptMap::EntryInfo::Has, 1);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::set, &JavascriptMap::EntryInfo::Set, 2);

        library->AddAccessorsToLibraryObject(mapPrototype, PropertyIds::size, &JavascriptMap::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* entriesFunc;
        entriesFunc = library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::entries, &JavascriptMap::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::keys, &JavascriptMap::EntryInfo::Keys, 0);
        library->AddFunctionToLibraryObject(mapPrototype, PropertyIds::values, &JavascriptMap::EntryInfo::Values, 0);
        library->AddMember(mapPrototype, PropertyIds::_symbolIterator, entriesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mapPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Map")), PropertyConfigurable);
        }

        mapPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }